

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O2

void BulkTransaction(CMutableTransaction *tx,int32_t target_weight)

{
  uint uVar1;
  pointer pCVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  CScript *pCVar6;
  uint uVar7;
  char *__assertion;
  long in_FS_OFFSET;
  int local_ac;
  undefined1 local_a8 [128];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = 0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._0_8_ = (char *)0x0;
  local_a8._8_8_ = 0;
  pCVar6 = CScript::operator<<((CScript *)local_a8,OP_RETURN);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx->vout,&local_ac,pCVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  CTransaction::CTransaction((CTransaction *)local_a8,tx);
  iVar4 = GetTransactionWeight((CTransaction *)local_a8);
  CTransaction::~CTransaction((CTransaction *)local_a8);
  if (target_weight < iVar4) {
    __assertion = "target_weight >= unpadded_weight";
    uVar5 = 0x4e;
  }
  else {
    uVar5 = ((target_weight - iVar4) + 3) / 4;
    uVar7 = 0;
    if (0xfc < uVar5) {
      if (uVar5 < 0x10000) {
        uVar7 = 0xfffffffe;
      }
      else {
        uVar7 = (uint)(-7 < target_weight - iVar4) << 2 | 0xfffffff8;
      }
    }
    pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = (pCVar2->scriptPubKey).super_CScriptBase._size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    pCVar6 = (CScript *)(pCVar2->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar6 = &pCVar2->scriptPubKey;
    }
    local_a8[0] = 0x51;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&(pCVar2->scriptPubKey).super_CScriptBase,
               (uchar *)((long)&(pCVar6->super_CScriptBase)._union + (long)(int)uVar3),uVar7 + uVar5
               ,local_a8);
    CTransaction::CTransaction((CTransaction *)local_a8,tx);
    iVar4 = GetTransactionWeight((CTransaction *)local_a8);
    if (iVar4 < target_weight) {
      __assertion = "GetTransactionWeight(CTransaction(tx)) >= target_weight";
      uVar5 = 0x5a;
    }
    else {
      CTransaction::~CTransaction((CTransaction *)local_a8);
      CTransaction::CTransaction((CTransaction *)local_a8,tx);
      iVar4 = GetTransactionWeight((CTransaction *)local_a8);
      if (iVar4 <= target_weight + 3) {
        CTransaction::~CTransaction((CTransaction *)local_a8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return;
        }
        __stack_chk_fail();
      }
      __assertion = "GetTransactionWeight(CTransaction(tx)) <= target_weight + 3";
      uVar5 = 0x5b;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                ,uVar5,"void BulkTransaction(CMutableTransaction &, int32_t)");
}

Assistant:

void BulkTransaction(CMutableTransaction& tx, int32_t target_weight)
{
    tx.vout.emplace_back(0, CScript() << OP_RETURN);
    auto unpadded_weight{GetTransactionWeight(CTransaction(tx))};
    assert(target_weight >= unpadded_weight);

    // determine number of needed padding bytes by converting weight difference to vbytes
    auto dummy_vbytes = (target_weight - unpadded_weight + (WITNESS_SCALE_FACTOR - 1)) / WITNESS_SCALE_FACTOR;
    // compensate for the increase of the compact-size encoded script length
    // (note that the length encoding of the unpadded output script needs one byte)
    dummy_vbytes -= GetSizeOfCompactSize(dummy_vbytes) - 1;

    // pad transaction by repeatedly appending a dummy opcode to the output script
    tx.vout[0].scriptPubKey.insert(tx.vout[0].scriptPubKey.end(), dummy_vbytes, OP_1);

    // actual weight should be at most 3 higher than target weight
    assert(GetTransactionWeight(CTransaction(tx)) >= target_weight);
    assert(GetTransactionWeight(CTransaction(tx)) <= target_weight + 3);
}